

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathBenchmark.cpp
# Opt level: O3

void __thiscall
PathBenchmark::run(PathBenchmark *this,unsigned_long deletions,unsigned_long queries)

{
  ostream *poVar1;
  invalid_argument *this_00;
  double dVar2;
  double extraout_XMM0_Qa;
  
  if (deletions <=
      (this->super_Benchmark).G.super_UndirectedGraph.super_type.m_edges.
      super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
      ._M_impl._M_node._M_size) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[i] path initialization time: ",0x1e);
    *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) &
         0xfffffefb | 4;
    dVar2 = Benchmark::getInitTime(&this->super_Benchmark);
    std::ostream::_M_insert<double>(dVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," seconds (",10);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," vertices ",10);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," edges)",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[i] path deletion time: ",0x18);
    *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) &
         0xfffffefb | 4;
    (**(this->super_Benchmark)._vptr_Benchmark)(this,deletions);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," seconds (",10);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," deletions)",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[i] path query time: ",0x15);
    *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) &
         0xfffffefb | 4;
    dVar2 = Benchmark::getQueryTime(&this->super_Benchmark,queries);
    poVar1 = std::ostream::_M_insert<double>(dVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," seconds (",10);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," queries)",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"PathBenchmark: Too many deletions");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void PathBenchmark::run(unsigned long deletions, unsigned long queries)
{
    if (deletions > num_edges(G)) {
        throw std::invalid_argument("PathBenchmark: Too many deletions");
    }

    std::cout << "[i] path initialization time: " << std::fixed << this->getInitTime();
    std::cout << " seconds (" << num_vertices(G) << " vertices " << num_edges(G) << " edges)" << std::endl;
    std::cout << "[i] path deletion time: " << std::fixed << this->getDeletionsTime(deletions);
    std::cout << " seconds (" << deletions << " deletions)" << std::endl;
    std::cout << "[i] path query time: ";
    std::cout << std::fixed << this->getQueryTime(queries) << " seconds (" << queries << " queries)" << std::endl;
}